

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O1

TestStatus *
vkt::pipeline::anon_unknown_0::testNoAtt
          (TestStatus *__return_storage_ptr__,Context *context,bool multisample)

{
  int *piVar1;
  undefined1 *puVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  void *pvVar4;
  undefined8 fragmentModule;
  undefined8 uVar5;
  undefined8 pipelineLayout;
  undefined8 uVar6;
  undefined4 uVar7;
  VkDeviceSize obj;
  pointer renderPass;
  TestStatus *pTVar8;
  bool bVar9;
  int i;
  deUint32 queueFamilyIndex;
  int iVar10;
  VkResult result;
  VkPhysicalDeviceFeatures *pVVar11;
  DeviceInterface *deviceInterface;
  VkDevice device;
  Allocator *allocator;
  const_iterator cVar12;
  TextureFormat format_00;
  DescriptorSetLayoutBuilder *this;
  DescriptorPoolBuilder *this_00;
  DescriptorSetUpdateBuilder *this_01;
  deUint64 *pdVar13;
  long lVar14;
  NotSupportedError *this_02;
  VkDeviceSize bufferSize;
  int y;
  VkBufferUsageFlags height;
  int x;
  VkBufferCreateInfo bufferCreateInfo;
  uint uStack_394;
  VkDeviceSize vertexBufferOffset;
  undefined1 auStack_370 [24];
  undefined1 *local_358;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  deUint32 dStack_348;
  undefined4 uStack_344;
  VkSubpassDependency *pVStack_340;
  VkCommandBuffer local_338;
  long *plStack_330;
  VkBufferCreateFlags local_328;
  undefined4 uStack_324;
  undefined8 uStack_320;
  Move<vk::Handle<(vk::HandleType)23>_> framebuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  Move<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  Move<vk::Handle<(vk::HandleType)18>_> local_288;
  UVec4 local_268;
  long local_258 [2];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> imageAlloc;
  Move<vk::Handle<(vk::HandleType)9>_> image;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_210;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  Move<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1b0;
  TestStatus *local_190;
  VkQueue local_188;
  TextureFormat format;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_170;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined4 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_130;
  VkCommandPool local_128;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_120;
  Move<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_e0;
  VkShaderModule local_c8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_c0;
  VkDescriptorImageInfo descriptorImageInfo;
  Move<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)13>_> imageView;
  IVec3 local_3c;
  
  local_190 = __return_storage_ptr__;
  pVVar11 = Context::getDeviceFeatures(context);
  if (pVVar11->fragmentStoresAndAtomics == 0) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&bufferCreateInfo,"fragmentStoresAndAtomics feature not supported","");
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&bufferCreateInfo);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  deviceInterface = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_188 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  allocator = Context::getDefaultAllocator(context);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  puVar2 = auStack_370 + 8;
  vertexBufferOffset = (VkDeviceSize)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"vert","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,deviceInterface,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  DStack_c0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_c8.m_internal = bufferCreateInfo._0_8_;
  DStack_c0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((undefined1 *)vertexBufferOffset != puVar2) {
    operator_delete((void *)vertexBufferOffset,auStack_370._8_8_ + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  vertexBufferOffset = (VkDeviceSize)puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vertexBufferOffset,"frag","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&vertexBufferOffset);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&bufferCreateInfo,deviceInterface,device,
             *(ProgramBinary **)(cVar12._M_node + 2),0);
  fragmentModule = bufferCreateInfo._0_8_;
  DStack_e0.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  DStack_e0.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  if ((undefined1 *)vertexBufferOffset != puVar2) {
    operator_delete((void *)vertexBufferOffset,auStack_370._8_8_ + 1);
  }
  height = (uint)multisample + (uint)multisample * 2 + 1;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 1;
  bufferCreateInfo.size._0_4_ = 0x25;
  bufferCreateInfo.size._4_4_ = 4;
  uVar7 = bufferCreateInfo.size._4_4_;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
  bufferCreateInfo.queueFamilyIndexCount = 1;
  bufferCreateInfo._44_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.usage = height;
  ::vk::createImage(&image,deviceInterface,device,(VkImageCreateInfo *)&bufferCreateInfo,
                    (VkAllocationCallbacks *)0x0);
  bindImage(&imageAlloc,deviceInterface,device,allocator,
            (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
            (MemoryRequirement)0x0);
  local_140 = 1;
  uStack_138 = 1;
  local_130 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView(&imageView,deviceInterface,device,
                (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                         m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,subresourceRange)
  ;
  format_00 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar10 = tcu::getPixelSize(format_00);
  makeBufferCreateInfo(&bufferCreateInfo,(long)(iVar10 << ((multisample & 7U) << 2 | 2)),2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,deviceInterface,
                     device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  obj = vertexBufferOffset;
  DStack_1b0.m_deviceIface = (DeviceInterface *)auStack_370._0_8_;
  DStack_1b0.m_device = (VkDevice)auStack_370._8_8_;
  DStack_1b0.m_allocator = (VkAllocationCallbacks *)auStack_370._16_8_;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             deviceInterface,device,allocator,(VkBuffer)vertexBufferOffset,(MemoryRequirement)0x1);
  uVar5 = bufferCreateInfo._0_8_;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&bufferCreateInfo);
  this = ::vk::DescriptorSetLayoutBuilder::addBinding
                   ((DescriptorSetLayoutBuilder *)&bufferCreateInfo,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE
                    ,1,0x10,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build(&descriptorSetLayout,this,deviceInterface,device,0);
  pvVar4 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            bufferCreateInfo.pQueueFamilyIndices._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,((ulong)uStack_394 << 0x20) - (long)pvVar4);
  }
  pvVar4 = (void *)CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount)
                           - (long)pvVar4);
  }
  if (bufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_)
    ;
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferCreateInfo);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&bufferCreateInfo,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1
                      );
  ::vk::DescriptorPoolBuilder::build(&descriptorPool,this_00,deviceInterface,device,1,1);
  if (bufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ - bufferCreateInfo._0_8_)
    ;
  }
  makeDescriptorSet(&descriptorSet,deviceInterface,device,
                    (VkDescriptorPool)
                    descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object
                    .m_internal);
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageView.m_internal =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&bufferCreateInfo);
  this_01 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&bufferCreateInfo,
                       (int)descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                            object.m_internal,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_01,deviceInterface,device);
  pvVar4 = (void *)CONCAT44(bufferCreateInfo.pQueueFamilyIndices._4_4_,
                            bufferCreateInfo.pQueueFamilyIndices._0_4_);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,((ulong)uStack_394 << 0x20) - (long)pvVar4);
  }
  pvVar4 = (void *)CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(bufferCreateInfo._44_4_,bufferCreateInfo.queueFamilyIndexCount)
                           - (long)pvVar4);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&bufferCreateInfo);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&bufferCreateInfo,deviceInterface,
                     device,(VkDescriptorSetLayout)
                            descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                            m_data.object.m_internal);
  pipelineLayout = bufferCreateInfo._0_8_;
  DStack_170.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  DStack_170.m_device = (VkDevice)bufferCreateInfo._16_8_;
  DStack_170.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo._44_4_ = 0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.size._0_4_ = 0;
  bufferCreateInfo.size._4_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateInfo._4_4_ = 0;
  bufferCreateInfo.pNext = (void *)0x0;
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  _M_realloc_insert<vk::VkSubpassDescription_const&>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)
             &framebuffer,(iterator)0x0,(VkSubpassDescription *)&bufferCreateInfo);
  auStack_370._0_8_ = (DeviceInterface *)0x0;
  dStack_348 = 0;
  uStack_344 = 0;
  pVStack_340 = (VkSubpassDependency *)0x0;
  auStack_370._8_8_ = 0;
  auStack_370._16_8_ = 0;
  vertexBufferOffset = 0x26;
  local_358 = &DAT_00000001;
  uStack_350 = (undefined4)
               framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  uStack_34c = (undefined4)
               (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
               >> 0x20);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&vertices,deviceInterface,device,
             (VkRenderPassCreateInfo *)&vertexBufferOffset,(VkAllocationCallbacks *)0x0);
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    operator_delete((void *)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object
                            .m_internal,
                    (long)framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                          m_device -
                    framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
                    m_internal);
  }
  renderPass = vertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
  DStack_210.m_deviceIface =
       (DeviceInterface *)
       vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  DStack_210.m_device =
       (VkDevice)
       vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bufferCreateInfo,deviceInterface,device,2,
             queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  DStack_120.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  DStack_120.m_device = (VkDevice)bufferCreateInfo._16_8_;
  local_128.m_internal = bufferCreateInfo._0_8_;
  DStack_120.m_deviceIface = (DeviceInterface *)bufferCreateInfo.pNext;
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&bufferCreateInfo,deviceInterface,device,
                    (VkCommandPool)bufferCreateInfo._0_8_);
  uStack_320 = CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  local_328 = bufferCreateInfo.flags;
  uStack_324 = bufferCreateInfo._20_4_;
  local_338 = (VkCommandBuffer)bufferCreateInfo._0_8_;
  plStack_330 = (long *)bufferCreateInfo.pNext;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bufferCreateInfo.sType = 0xbe800000;
  bufferCreateInfo._4_4_ = 0xbe800000;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&bufferCreateInfo);
  bufferCreateInfo.sType = 0xbe800000;
  bufferCreateInfo._4_4_ = 0x3e800000;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&bufferCreateInfo);
  bufferCreateInfo.sType = 0x3e800000;
  bufferCreateInfo._4_4_ = 0xbe800000;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&bufferCreateInfo);
  bufferCreateInfo.sType = 0x3e800000;
  bufferCreateInfo._4_4_ = 0x3e800000;
  bufferCreateInfo.pNext = (void *)0x3f80000000000000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&bufferCreateInfo);
  bufferSize = (long)vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vertices.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo(&bufferCreateInfo,bufferSize,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&vertexBufferOffset,deviceInterface,
                     device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  bufferCreateInfo._16_8_ = auStack_370._8_8_;
  bufferCreateInfo.size._0_4_ = (undefined4)auStack_370._16_8_;
  bufferCreateInfo.size._4_4_ = SUB84(auStack_370._16_8_,4);
  bufferCreateInfo._0_8_ = vertexBufferOffset;
  bufferCreateInfo.pNext = (void *)auStack_370._0_8_;
  vertexBufferOffset = 0;
  auStack_370._0_8_ = (DeviceInterface *)0x0;
  auStack_370._8_8_ = 0;
  auStack_370._16_8_ = 0;
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (vertexBufferOffset != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)auStack_370,(VkBuffer)vertexBufferOffset);
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&bufferCreateInfo,
             deviceInterface,device,allocator,
             (VkBuffer)
             vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  uVar6 = bufferCreateInfo._0_8_;
  memcpy(*(void **)(bufferCreateInfo._0_8_ + 0x18),
         vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
         ._M_impl.super__Vector_impl_data._M_start,bufferSize);
  ::vk::flushMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(uVar6 + 8),
             *(VkDeviceSize *)(uVar6 + 0x10),bufferSize);
  if (vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vertices.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vertices.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_3c.m_data[0] = 0x20;
  local_3c.m_data[1] = 0x20;
  local_3c.m_data[2] = 1;
  makeGraphicsPipeline
            (&local_288,deviceInterface,device,(VkPipelineLayout)pipelineLayout,
             (VkRenderPass)renderPass,local_c8,(VkShaderModule)fragmentModule,&local_3c,
             VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,false,multisample);
  pdVar13 = (deUint64 *)operator_new(0x20);
  pdVar13[2] = (deUint64)
               local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pdVar13[3] = (deUint64)
               local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  *pdVar13 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pdVar13[1] = (deUint64)
               local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
  ;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._0_8_ = pdVar13;
  bufferCreateInfo.pNext = operator_new(0x20);
  *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 0;
  *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 0;
  *(undefined ***)bufferCreateInfo.pNext = &PTR__SharedPtrState_00d1e0d0;
  *(deUint64 **)((long)bufferCreateInfo.pNext + 0x10) = pdVar13;
  *(undefined4 *)((long)bufferCreateInfo.pNext + 8) = 1;
  *(undefined4 *)((long)bufferCreateInfo.pNext + 0xc) = 1;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
              *)&pipeline,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)
             &bufferCreateInfo);
  if (bufferCreateInfo.pNext != (void *)0x0) {
    LOCK();
    piVar1 = (int *)((long)bufferCreateInfo.pNext + 8);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      bufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      bufferCreateInfo._4_4_ = 0;
      (**(code **)(*bufferCreateInfo.pNext + 0x10))();
    }
    LOCK();
    piVar1 = (int *)((long)bufferCreateInfo.pNext + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (bufferCreateInfo.pNext != (void *)0x0) {
        (**(code **)(*bufferCreateInfo.pNext + 8))();
      }
      bufferCreateInfo.pNext = (void *)0x0;
    }
  }
  if (local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&vertexBufferOffset,deviceInterface,
                  device,(VkRenderPass)renderPass,0,(VkImageView *)0x0,0x20,0x20,1);
  bufferCreateInfo._16_8_ = auStack_370._8_8_;
  bufferCreateInfo.size._0_4_ = (undefined4)auStack_370._16_8_;
  bufferCreateInfo.size._4_4_ = SUB84(auStack_370._16_8_,4);
  bufferCreateInfo._0_8_ = vertexBufferOffset;
  bufferCreateInfo.pNext = (void *)auStack_370._0_8_;
  vertexBufferOffset = 0;
  auStack_370._0_8_ = (DeviceInterface *)0x0;
  auStack_370._8_8_ = 0;
  auStack_370._16_8_ = 0;
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(bufferCreateInfo.size._4_4_,(undefined4)bufferCreateInfo.size);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)bufferCreateInfo._16_8_;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       bufferCreateInfo._0_8_;
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)bufferCreateInfo.pNext;
  if (vertexBufferOffset != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)auStack_370,
               (VkFramebuffer)vertexBufferOffset);
  }
  beginCommandBuffer(deviceInterface,local_338);
  local_158 = 1;
  uStack_150 = 1;
  local_148 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&bufferCreateInfo,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,
             subresourceRange_00);
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,local_338,1,0x80,0,0,0,0,0,1,
             (int)(VkImageMemoryBarrier *)&bufferCreateInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo._16_8_ = renderPass;
  bufferCreateInfo.size._0_4_ =
       (undefined4)
       framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  bufferCreateInfo.size._4_4_ =
       (undefined4)
       (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal >> 0x20)
  ;
  bufferCreateInfo.usage = 0;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0x20;
  bufferCreateInfo._44_4_ = 0x20;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
  vertexBufferOffset = 0;
  (*deviceInterface->_vptr_DeviceInterface[0x74])(deviceInterface,local_338,&bufferCreateInfo,0);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,local_338,0,
             ((pipeline.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_ptr->
             super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x58])
            (deviceInterface,local_338,0,1,&vertexBuffer,&vertexBufferOffset);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,local_338,0,pipelineLayout,0,1,(int)&descriptorSet,0,0);
  (*deviceInterface->_vptr_DeviceInterface[0x59])(deviceInterface,local_338,4,1,0,0);
  (*deviceInterface->_vptr_DeviceInterface[0x76])(deviceInterface,local_338);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0x40;
  bufferCreateInfo._20_4_ = 0x800;
  bufferCreateInfo.size._0_4_ = 1;
  bufferCreateInfo.size._4_4_ = 6;
  bufferCreateInfo.usage = 0xffffffff;
  bufferCreateInfo.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount =
       (deUint32)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  bufferCreateInfo._44_4_ =
       SUB84(image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal >> 0x20,0)
  ;
  bufferCreateInfo.pQueueFamilyIndices._0_4_ = 1;
  bufferCreateInfo.pQueueFamilyIndices._4_4_ = 0;
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,local_338,0x400,0x1000,0,0,0,0,0,1,(int)&bufferCreateInfo);
  vertexBufferOffset = 0;
  auStack_370._0_8_ = (DeviceInterface *)0x0;
  auStack_370._8_8_ = 1;
  auStack_370._16_8_ = 0x100000000;
  local_358 = (undefined1 *)0x0;
  uStack_350 = 0;
  uStack_344 = 1;
  uStack_34c = uVar7;
  dStack_348 = height;
  (*deviceInterface->_vptr_DeviceInterface[99])
            (deviceInterface,local_338,
             image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,6,obj,1,
             (int)&vertexBufferOffset);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(vertices.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2c);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200000001000;
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,local_338,0x1000,0x4000,0,0,0,1,(int)&vertices,0,0);
  result = (*deviceInterface->_vptr_DeviceInterface[0x4a])(deviceInterface,local_338);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineFramebufferAttachmentTests.cpp"
                    ,0x43e);
  submitCommandsAndWait(deviceInterface,device,local_188,local_338);
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(uVar5 + 8),
             *(VkDeviceSize *)(uVar5 + 0x10),0xffffffffffffffff);
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&bufferCreateInfo,&format,4,height,1);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&vertexBufferOffset,(TextureLevel *)&bufferCreateInfo);
  if (0 < (int)auStack_370._8_4_) {
    iVar10 = 0;
    do {
      if (0 < (int)auStack_370._4_4_) {
        y = 0;
        do {
          if (0 < (int)auStack_370._0_4_) {
            x = 0;
            do {
              vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x3f0000003f800000;
              vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f8000003e800000;
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&vertexBufferOffset,(Vec4 *)&vertices,x,y,iVar10);
              x = x + 1;
            } while (x < (int)auStack_370._0_4_);
          }
          y = y + 1;
        } while (y < (int)auStack_370._4_4_);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (int)auStack_370._8_4_);
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&vertices,&format,4,height,1,*(void **)(uVar5 + 0x18));
  log = context->m_testCtx->m_log;
  lVar14 = 0;
  do {
    local_268.m_data[lVar14] = 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  bVar9 = tcu::intThresholdCompare
                    (log,"Image Comparison","",(ConstPixelBufferAccess *)&vertexBufferOffset,
                     (ConstPixelBufferAccess *)&vertices,&local_268,COMPARE_LOG_RESULT);
  pTVar8 = local_190;
  if (bVar9) {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
  }
  else {
    local_268.m_data._0_8_ = local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Fail","");
    pTVar8->m_code = QP_TEST_RESULT_FAIL;
    (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar8->m_description,local_268.m_data._0_8_,
               local_268.m_data._8_8_ + local_268.m_data._0_8_);
    if ((long *)local_268.m_data._0_8_ != local_258) {
      operator_delete((void *)local_268.m_data._0_8_,local_258[0] + 1);
    }
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&bufferCreateInfo);
    if (!bVar9) goto LAB_004e6395;
  }
  bufferCreateInfo._0_8_ = &bufferCreateInfo.flags;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bufferCreateInfo,"Pass","");
  pTVar8->m_code = QP_TEST_RESULT_PASS;
  (pTVar8->m_description)._M_dataplus._M_p = (pointer)&(pTVar8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar8->m_description,bufferCreateInfo._0_8_,
             (long)bufferCreateInfo.pNext + bufferCreateInfo._0_8_);
  if ((VkBufferCreateFlags *)bufferCreateInfo._0_8_ != &bufferCreateInfo.flags) {
    operator_delete((void *)bufferCreateInfo._0_8_,bufferCreateInfo._16_8_ + 1);
  }
LAB_004e6395:
  if (local_338 != (VkCommandBuffer)0x0) {
    bufferCreateInfo._0_8_ = local_338;
    (**(code **)(*plStack_330 + 0x240))(plStack_330,_local_328,uStack_320,1);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_120,local_128);
  }
  if (framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (renderPass != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_210,(VkRenderPass)renderPass);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  if (pipelineLayout != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_170,(VkPipelineLayout)pipelineLayout);
  }
  if (descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal != 0) {
    bufferCreateInfo._0_8_ =
         descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    (*(descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x3d])
              (descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
               m_deviceIface,
               descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device,
               descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal,1);
  }
  if (descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter,
               (VkDescriptorPool)
               descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
               m_internal);
  }
  if (descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,
               (VkDescriptorSetLayout)
               descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
               m_internal);
  }
  if (uVar5 != 0) {
    (**(code **)(*(long *)uVar5 + 8))(uVar5);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1b0,(VkBuffer)obj)
    ;
  }
  if (imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               (VkImageView)
               imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal);
  }
  if (imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
      ->_vptr_Allocation[1])();
    imageAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
              );
  }
  if (fragmentModule != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_e0,(VkShaderModule)fragmentModule);
  }
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_c0,local_c8);
  }
  if (uVar6 != 0) {
    (**(code **)(*(long *)uVar6 + 8))(uVar6);
  }
  if (vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return pTVar8;
}

Assistant:

tcu::TestStatus testNoAtt (Context& context, const bool multisample)
{
	const VkPhysicalDeviceFeatures		features				= context.getDeviceFeatures();
	if (!features.fragmentStoresAndAtomics)
		throw tcu::NotSupportedError("fragmentStoresAndAtomics feature not supported");

	const DeviceInterface&				vk						= context.getDeviceInterface();
	const VkDevice						device					= context.getDevice();
	const VkQueue						queue					= context.getUniversalQueue();
	const deUint32						queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	Allocator&							allocator				= context.getDefaultAllocator();
	const IVec3							renderSize				(32, 32, 1);

	Move<VkBuffer>						vertexBuffer;
	MovePtr<Allocation>					vertexBufferAlloc;

	const Unique<VkShaderModule>		vertexModule			(createShaderModule (vk, device, context.getBinaryCollection().get("vert"), 0u));
	const Unique<VkShaderModule>		fragmentModule			(createShaderModule (vk, device, context.getBinaryCollection().get("frag"), 0u));

	// Create image where we will record the writes. For single-sampled cases this is a 4x1 image
	// and for multi-sampled cases this is a 4x<num_samples> image.
	const deUint8						numSamples				= multisample ? 4 : 1;
	const deUint8						imageWidth				= 4;
	const deUint8						imageHeight				= numSamples;
	const deUint8						imageDepth				= 1;
	const deUint8						imageLayers				= 1;
	const IVec3							imageDim				= IVec3(imageWidth, imageHeight, imageDepth);
	const VkImageUsageFlags				imageUsage				= VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT;
	const Move<VkImage>					image					= makeImage(vk, device, VkImageViewCreateFlags(0), VK_IMAGE_TYPE_2D, COLOR_FORMAT, imageDim, imageLayers, imageUsage, false);
	const VkImageSubresourceRange		imageSubresourceRange	= makeColorSubresourceRange(0u, imageLayers);
	const MovePtr<Allocation>			imageAlloc				= bindImage(vk, device, allocator, *image, MemoryRequirement::Any);
	const Move<VkImageView>				imageView				= makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, COLOR_FORMAT, imageSubresourceRange);

	// Create a buffer where we will copy the image for verification
	const VkDeviceSize					colorBufferSize		= imageWidth * imageHeight * imageDepth * numSamples * tcu::getPixelSize(mapVkFormat(COLOR_FORMAT));
	const Unique<VkBuffer>				colorBuffer			(makeBuffer(vk, device, colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	const UniquePtr<Allocation>			colorBufferAlloc	(bindBuffer(vk, device, allocator, *colorBuffer, MemoryRequirement::HostVisible));

	// Create pipeline descriptor set for the image
	const Move<VkDescriptorSetLayout>	descriptorSetLayout		= DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_FRAGMENT_BIT)
		.build(vk, device);

	const Move<VkDescriptorPool>		descriptorPool			= DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, 1)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1);

	const Move<VkDescriptorSet>			descriptorSet			= makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout);
	const VkDescriptorImageInfo			descriptorImageInfo		= makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(vk, device);

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout (vk, device, *descriptorSetLayout));
	vector<SharedPtrVkPipeline>			pipeline;
	const Unique<VkRenderPass>			renderPass				(makeRenderPassNoAtt (vk, device));
	Move<VkFramebuffer>					framebuffer;

	const Unique<VkCommandPool>			cmdPool					(createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>		cmdBuffer				(makeCommandBuffer (vk, device, *cmdPool));

	// create vertexBuffer
	{
		const vector<tcu::Vec4>	vertices			= genPointVertices();
		const VkDeviceSize		vertexBufferSize	= sizeInBytes(vertices);

		vertexBuffer		= makeBuffer(vk, device, vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		vertexBufferAlloc	= bindBuffer(vk, device, allocator, *vertexBuffer, MemoryRequirement::HostVisible);
		deMemcpy(vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(vertexBufferSize));
		flushMappedMemoryRange(vk, device, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset(), vertexBufferSize);
	}

	// Create render pass and pipeline
	pipeline.push_back(makeSharedPtr(makeGraphicsPipeline(vk, device, *pipelineLayout, *renderPass, *vertexModule, *fragmentModule,
		renderSize, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0, false, multisample)));
	framebuffer = makeFramebuffer(vk, device, *renderPass, 0, DE_NULL, renderSize.x(), renderSize.y());

	// Record command buffer
	beginCommandBuffer(vk, *cmdBuffer);
	{
		// shader image layout transition undefined -> general
		{
			const VkImageMemoryBarrier setImageLayoutBarrier = makeImageMemoryBarrier(
				0u, VK_ACCESS_SHADER_WRITE_BIT,
				VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
				*image, imageSubresourceRange);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0,
				0, DE_NULL, 0, DE_NULL, 1, &setImageLayoutBarrier);
		}

		// Render pass
		{
			const VkRect2D renderArea =
			{
				makeOffset2D(0, 0),
				makeExtent2D(renderSize.x(), renderSize.y()),
			};
			const VkRenderPassBeginInfo renderPassBeginInfo =
			{
				VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType         sType;
				DE_NULL,									// const void*             pNext;
				*renderPass,								// VkRenderPass            renderPass;
				*framebuffer,								// VkFramebuffer           framebuffer;
				renderArea,									// VkRect2D                renderArea;
				0,											// uint32_t                clearValueCount;
				DE_NULL,									// const VkClearValue*     pClearValues;
			};
			const VkDeviceSize vertexBufferOffset = 0ull;

			vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, **pipeline[0]);
			vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, pipelineLayout.get(), 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
			vk.cmdDraw(*cmdBuffer, 4u, 1u, 0u, 0u);

			vk.cmdEndRenderPass(*cmdBuffer);
		}

		// copy image to host visible colorBuffer
		{
			const VkImageMemoryBarrier	imageBarriers[]		=
			{
				{
					VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
					DE_NULL,									// const void*				pNext;
					VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
					VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
					VK_IMAGE_LAYOUT_GENERAL,					// VkImageLayout			oldLayout;
					VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
					*image,										// VkImage					image;
					makeColorSubresourceRange(0, 1)				// VkImageSubresourceRange	subresourceRange;
				}
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
				0u, DE_NULL, 0u, DE_NULL, 1u, imageBarriers);

			const VkBufferImageCopy		region				=
			{
				0ull,																// VkDeviceSize                bufferOffset;
				0u,																	// uint32_t                    bufferRowLength;
				0u,																	// uint32_t                    bufferImageHeight;
				makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1),	// VkImageSubresourceLayers    imageSubresource;
				makeOffset3D(0, 0, 0),												// VkOffset3D                  imageOffset;
				makeExtent3D(IVec3(imageWidth, imageHeight, imageDepth)),			// VkExtent3D                  imageExtent;
			};

			vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &region);

			const VkBufferMemoryBarrier	bufferBarriers[]	=
			{
				{
					VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType    sType;
					DE_NULL,									// const void*        pNext;
					VK_ACCESS_TRANSFER_WRITE_BIT,				// VkAccessFlags      srcAccessMask;
					VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags      dstAccessMask;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           srcQueueFamilyIndex;
					VK_QUEUE_FAMILY_IGNORED,					// uint32_t           dstQueueFamilyIndex;
					*colorBuffer,								// VkBuffer           buffer;
					0ull,										// VkDeviceSize       offset;
					VK_WHOLE_SIZE,								// VkDeviceSize       size;
				},
			};

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, DE_LENGTH_OF_ARRAY(bufferBarriers), bufferBarriers, 0u, DE_NULL);
		}
	} // beginCommandBuffer

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc->getMemory(), colorBufferAlloc->getOffset(), VK_WHOLE_SIZE);
		const tcu::TextureFormat			format			= mapVkFormat(COLOR_FORMAT);
		tcu::TextureLevel					textureLevel	(format, imageWidth, imageHeight, imageDepth);
		const tcu::PixelBufferAccess		expectedImage	= getExpectedDataNoAtt(textureLevel);
		const tcu::ConstPixelBufferAccess	resultImage		(format, imageWidth, imageHeight, imageDepth, colorBufferAlloc->getHostPtr());

		if (!tcu::intThresholdCompare(context.getTestContext().getLog(), "Image Comparison", "", expectedImage, resultImage, tcu::UVec4(1), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Fail");
	}

	return tcu::TestStatus::pass("Pass");
}